

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O3

void __thiscall zmq::xpub_t::~xpub_t(xpub_t *this)

{
  string *this_00;
  
  this_00 = &this[-1].super_socket_base_t.super_own_t.options.gss_principal;
  ~xpub_t((xpub_t *)this_00);
  operator_delete(this_00,0x8e8);
  return;
}

Assistant:

zmq::xpub_t::~xpub_t ()
{
    _welcome_msg.close ();
    for (std::deque<metadata_t *>::iterator it = _pending_metadata.begin (),
                                            end = _pending_metadata.end ();
         it != end; ++it)
        if (*it && (*it)->drop_ref ())
            LIBZMQ_DELETE (*it);
}